

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool SparseKeyTest<288,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  keytype k;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x120,pcVar2,(ulong)(uint)setbits)
  ;
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Blob<288>::Blob(&k);
  k.bytes[0x20] = '\0';
  k.bytes[0x21] = '\0';
  k.bytes[0x22] = '\0';
  k.bytes[0x23] = '\0';
  k.bytes[0] = '\0';
  k.bytes[1] = '\0';
  k.bytes[2] = '\0';
  k.bytes[3] = '\0';
  k.bytes[4] = '\0';
  k.bytes[5] = '\0';
  k.bytes[6] = '\0';
  k.bytes[7] = '\0';
  k.bytes[8] = '\0';
  k.bytes[9] = '\0';
  k.bytes[10] = '\0';
  k.bytes[0xb] = '\0';
  k.bytes[0xc] = '\0';
  k.bytes[0xd] = '\0';
  k.bytes[0xe] = '\0';
  k.bytes[0xf] = '\0';
  k.bytes[0x10] = '\0';
  k.bytes[0x11] = '\0';
  k.bytes[0x12] = '\0';
  k.bytes[0x13] = '\0';
  k.bytes[0x14] = '\0';
  k.bytes[0x15] = '\0';
  k.bytes[0x16] = '\0';
  k.bytes[0x17] = '\0';
  k.bytes[0x18] = '\0';
  k.bytes[0x19] = '\0';
  k.bytes[0x1a] = '\0';
  k.bytes[0x1b] = '\0';
  k.bytes[0x1c] = '\0';
  k.bytes[0x1d] = '\0';
  k.bytes[0x1e] = '\0';
  k.bytes[0x1f] = '\0';
  if (iVar3 != 0) {
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize(&hashes,1);
    (*hash.m_hash)(&k,0x24,0,
                   hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  SparseKeygenRecurse<Blob<288>,Blob<160>>(hash.m_hash,0,setbits,inclusive,&k,&hashes);
  printf("%d keys\n",
         ((long)hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x14 & 0xffffffff,
         ((long)hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
               super__Vector_impl_data._M_start) % 0x14);
  bVar1 = TestHashList<Blob<160>>(&hashes,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  std::_Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>);
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}